

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdGetLastErrorMessage(void *handle,char **message)

{
  char *pcVar1;
  int iVar2;
  allocator local_79;
  string err_str;
  CfdException last_error;
  
  if (message == (char **)0x0) {
    iVar2 = 1;
  }
  else {
    cfd::capi::CfdCapiManager::GetLastError(&last_error,(CfdCapiManager *)message,handle);
    std::__cxx11::string::string((string *)&err_str,last_error.message_._M_dataplus._M_p,&local_79);
    pcVar1 = (char *)malloc(err_str._M_string_length + 1);
    if (pcVar1 == (char *)0x0) {
      iVar2 = 2;
    }
    else {
      iVar2 = 0;
      std::__cxx11::string::copy((char *)&err_str,(ulong)pcVar1,err_str._M_string_length + 1);
      pcVar1[err_str._M_string_length] = '\0';
      *message = pcVar1;
    }
    std::__cxx11::string::~string((string *)&err_str);
    cfd::core::CfdException::~CfdException(&last_error);
  }
  return iVar2;
}

Assistant:

int CfdGetLastErrorMessage(void* handle, char** message) {
  try {
    if (message == nullptr) return kCfdIllegalArgumentError;
    CfdException last_error = cfd::capi::capi_instance.GetLastError(handle);
    std::string err_str(last_error.what());
    size_t len = err_str.length() + 1;
    char* buffer = static_cast<char*>(malloc(len));
    if (buffer == nullptr) return kCfdIllegalStateError;
    err_str.copy(buffer, len);
    buffer[len - 1] = '\0';
    *message = buffer;
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}